

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O2

int bucket_insert(bucket b,void *key,void *value)

{
  pair ppVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  
  if ((key == (void *)0x0 || b == (bucket)0x0) || value == (void *)0x0) {
    pcVar6 = "Invalid bucket insert parameters";
    uVar5 = 0xf2;
LAB_00103b30:
    log_write_impl_va("metacall",uVar5,"bucket_insert",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                      ,3,pcVar6);
    iVar2 = 1;
  }
  else {
    if (b->pairs == (pair)0x0) {
      iVar2 = bucket_alloc_pairs(b,4);
      if (iVar2 != 0) {
        pcVar6 = "Invalid bucket insertion pairs allocation";
        uVar5 = 0xf8;
        goto LAB_00103b30;
      }
    }
    sVar3 = b->count;
    uVar4 = sVar3 + 1;
    if (b->capacity <= uVar4) {
      iVar2 = bucket_realloc_pairs(b,b->capacity * 2);
      if (iVar2 != 0) {
        pcVar6 = "Invalid bucket insertion pairs reallocation";
        uVar5 = 0x100;
        goto LAB_00103b30;
      }
      sVar3 = b->count;
      uVar4 = sVar3 + 1;
    }
    ppVar1 = b->pairs;
    ppVar1[sVar3].key = key;
    ppVar1[sVar3].value = value;
    b->count = uVar4;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int bucket_insert(bucket b, void *key, void *value)
{
	pair p;

	if (b == NULL || key == NULL || value == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket insert parameters");
		return 1;
	}

	if (b->pairs == NULL && bucket_alloc_pairs(b, BUCKET_PAIRS_DEFAULT) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket insertion pairs allocation");
		return 1;
	}

	if ((b->count + 1) >= b->capacity)
	{
		if (bucket_realloc_pairs(b, b->capacity << 1) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket insertion pairs reallocation");
			return 1;
		}
	}

	p = &b->pairs[b->count];

	p->key = key;
	p->value = value;

	++b->count;

	return 0;
}